

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool IR::Instr::HasSymUseDst(StackSym *sym,Opnd *dst)

{
  bool bVar1;
  int iVar2;
  IndirOpnd *this;
  RegOpnd *pRVar3;
  ListOpnd *this_00;
  ListOpndType *dst_00;
  SymOpnd *this_01;
  StackSym *pSVar4;
  PropertySymOpnd *this_02;
  PropertySymOpnd *propertySymOpnd;
  SymOpnd *symOpnd;
  int i;
  ListOpnd *list;
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  Opnd *dst_local;
  StackSym *sym_local;
  
  if (dst == (Opnd *)0x0) {
    return false;
  }
  bVar1 = Opnd::IsIndirOpnd(dst);
  if (bVar1) {
    this = Opnd::AsIndirOpnd(dst);
    pRVar3 = IndirOpnd::GetBaseOpnd(this);
    if ((pRVar3 != (RegOpnd *)0x0) && (pRVar3->m_sym == sym)) {
      return true;
    }
    pRVar3 = IndirOpnd::GetIndexOpnd(this);
    if ((pRVar3 != (RegOpnd *)0x0) && (pRVar3 = IndirOpnd::GetIndexOpnd(this), pRVar3->m_sym == sym)
       ) {
      return true;
    }
  }
  else {
    bVar1 = Opnd::IsListOpnd(dst);
    if (bVar1) {
      this_00 = Opnd::AsListOpnd(dst);
      for (symOpnd._4_4_ = 0; iVar2 = ListOpnd::Count(this_00), symOpnd._4_4_ < iVar2;
          symOpnd._4_4_ = symOpnd._4_4_ + 1) {
        dst_00 = ListOpnd::Item(this_00,symOpnd._4_4_);
        bVar1 = HasSymUseDst(sym,&dst_00->super_Opnd);
        if (bVar1) {
          return true;
        }
      }
    }
    else {
      bVar1 = Opnd::IsSymOpnd(dst);
      if (bVar1) {
        this_01 = Opnd::AsSymOpnd(dst);
        pSVar4 = (StackSym *)Opnd::GetSym(&this_01->super_Opnd);
        if (pSVar4 == sym) {
          return true;
        }
        bVar1 = SymOpnd::IsPropertySymOpnd(this_01);
        if (bVar1) {
          this_02 = Opnd::AsPropertySymOpnd(&this_01->super_Opnd);
          pSVar4 = PropertySymOpnd::GetObjectSym(this_02);
          if (pSVar4 == sym) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
Instr::HasSymUseDst(StackSym *sym, IR::Opnd* dst)
{
    if (!dst)
    {
        return false;
    }
    if (dst->IsIndirOpnd())
    {
        IR::IndirOpnd *indirOpnd = dst->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        if (baseOpnd != nullptr && baseOpnd->m_sym == sym)
        {
            return true;
        }
        else if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == sym)
        {
            return true;
        }
    }
    else if (dst->IsListOpnd())
    {
        IR::ListOpnd* list = dst->AsListOpnd();
        for (int i = 0; i < list->Count(); ++i)
        {
            if (HasSymUseDst(sym, list->Item(i)))
            {
                return true;
            }
        }
    }
    else if (dst->IsSymOpnd())
    {
        SymOpnd* symOpnd = dst->AsSymOpnd();
        if (symOpnd->GetSym() == sym)
        {
            return true;
        }
        if (symOpnd->IsPropertySymOpnd())
        {
            PropertySymOpnd* propertySymOpnd = symOpnd->AsPropertySymOpnd();
            if (propertySymOpnd->GetObjectSym() == sym)
            {
                return true;
            }
        }
    }
    return false;
}